

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
net_tests::anon_unknown_17::V2TransportTester::ReceivePacket
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          V2TransportTester *this,Span<const_std::byte> aad)

{
  pointer __dest;
  pointer puVar1;
  Span<std::byte> contents;
  readonly_property<bool> rVar2;
  uint32_t uVar3;
  size_t __n;
  byte *pbVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  bool *ignore_00;
  iterator pvVar7;
  ulong __new_size;
  pointer __src;
  long in_FS_OFFSET;
  const_string file;
  Span<const_std::byte> input;
  const_string file_00;
  Span<const_std::byte> input_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Span<const_std::byte> aad_00;
  bool ignore;
  check_type cVar8;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  byte *local_f8;
  check_type cStack_f0;
  bool local_e1;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  pvVar7 = (iterator)aad.m_size;
  pbVar4 = aad.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    local_48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_40 = "";
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x4c1;
    file.m_begin = (iterator)&local_48;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (2 < (ulong)((long)(this->m_received).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_received).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start));
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "m_received.size() >= BIP324Cipher::LENGTH_LEN";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_a8 = "";
    pvVar5 = (iterator)0x2;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,2,0,WARN,_cVar8,(size_t)&local_b0,0x4c1);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    input.m_size = 3;
    input.m_data = (this->m_received).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar3 = BIP324Cipher::DecryptLength(&this->m_cipher,input);
    local_c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x4c5;
    file_00.m_begin = (iterator)&local_c0;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,
               msg_00);
    __new_size = (ulong)uVar3;
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (__new_size + 0x14 <=
         (ulong)((long)(this->m_received).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->m_received).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start));
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "m_received.size() >= size + BIP324Cipher::EXPANSION";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_d8 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,2,0,WARN,_cVar8,(size_t)&local_e0,0x4c5);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,__new_size);
    local_e1 = false;
    input_00.m_data =
         (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + 3;
    local_f8 = (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    _cVar8 = (check_type)
             ((long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)local_f8);
    ignore_00 = &local_e1;
    contents.m_size = (size_t)_cVar8;
    contents.m_data = local_f8;
    input_00.m_size = __new_size + 0x11;
    aad_00.m_size = (size_t)pvVar7;
    aad_00.m_data = pbVar4;
    _cStack_f0 = _cVar8;
    rVar2.super_class_property<bool>.value =
         (class_property<bool>)
         BIP324Cipher::Decrypt(&this->m_cipher,input_00,aad_00,ignore_00,contents);
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4cf;
    file_01.m_begin = (iterator)&local_108;
    msg_01.m_end = ignore_00;
    msg_01.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
               msg_01);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "ret";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_128 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_120 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,_cVar8,(size_t)&local_128,0x4cf);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    __dest = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __src = __dest + __new_size + 0x14;
    if (__dest != __src) {
      __n = (long)(this->m_received).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
      puVar1 = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar1 != __dest + ((long)puVar1 - (long)__src)) {
        (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish = __dest + ((long)puVar1 - (long)__src);
      }
    }
    pbVar4 = (byte *)0x0;
    pvVar7 = (iterator)0x0;
  } while (local_e1 != false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<uint8_t> ReceivePacket(Span<const std::byte> aad = {})
    {
        std::vector<uint8_t> contents;
        // Loop as long as there are ignored packets that are to be skipped.
        while (true) {
            // When processing a packet, at least enough bytes for its length descriptor must be received.
            BOOST_REQUIRE(m_received.size() >= BIP324Cipher::LENGTH_LEN);
            // Decrypt the content length.
            size_t size = m_cipher.DecryptLength(MakeByteSpan(Span{m_received}.first(BIP324Cipher::LENGTH_LEN)));
            // Check that the full packet is in the receive buffer.
            BOOST_REQUIRE(m_received.size() >= size + BIP324Cipher::EXPANSION);
            // Decrypt the packet contents.
            contents.resize(size);
            bool ignore{false};
            bool ret = m_cipher.Decrypt(
                /*input=*/MakeByteSpan(
                    Span{m_received}.first(size + BIP324Cipher::EXPANSION).subspan(BIP324Cipher::LENGTH_LEN)),
                /*aad=*/aad,
                /*ignore=*/ignore,
                /*contents=*/MakeWritableByteSpan(contents));
            BOOST_CHECK(ret);
            // Don't expect AAD in further packets.
            aad = {};
            // Strip the processed packet's bytes off the front of the receive buffer.
            m_received.erase(m_received.begin(), m_received.begin() + size + BIP324Cipher::EXPANSION);
            // Stop if the ignore bit is not set on this packet.
            if (!ignore) break;
        }
        return contents;
    }